

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NoMeEdgeCalculator.cpp
# Opt level: O0

double __thiscall
NoMeEdgeCalculator::scoreSequences
          (NoMeEdgeCalculator *this,string *code1,string *qual1,string *code2,string *qual2,
          int start1,int end1,int start2,int end2,bool isStrand1,bool isClique,int numGCAllowedPos,
          int ct)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  string *psVar4;
  ulong uVar5;
  ulong uVar6;
  difference_type dVar7;
  difference_type dVar8;
  long lVar9;
  element_type *__p;
  string *in_RCX;
  string *in_RDX;
  string *in_RSI;
  long in_RDI;
  string *in_R8;
  int in_R9D;
  bool bVar10;
  double dVar11;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  byte in_stack_00000020;
  byte in_stack_00000028;
  int in_stack_00000030;
  double prob;
  double score;
  auto_ptr<hmm> hmmProbability;
  unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
  switchRateMap;
  int numberOfPositions2;
  int numberOfPositions1;
  string prevCountQual_1;
  string prevCountCode_1;
  int i_1;
  int distance_1;
  string prevCountQual;
  string prevCountCode;
  int i;
  int distance;
  int rightNonOverlapGCCount;
  int leftNonOverlapGCCount;
  string compareQual2;
  string compareString2;
  string compareQual1;
  string compareString1;
  int s2;
  int s1;
  int overlap;
  undefined4 in_stack_fffffffffffff8e8;
  undefined4 in_stack_fffffffffffff8ec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff8f0;
  auto_ptr<hmm> *this_00;
  char *in_stack_fffffffffffff900;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff908;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff910;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  undefined8 in_stack_fffffffffffff938;
  int __val;
  string *in_stack_fffffffffffff988;
  string *in_stack_fffffffffffff990;
  string *in_stack_fffffffffffff998;
  undefined7 in_stack_fffffffffffff9a0;
  undefined1 in_stack_fffffffffffff9a7;
  allocator *in_stack_fffffffffffff9a8;
  hmm *in_stack_fffffffffffff9b0;
  int minGCPositions;
  undefined8 in_stack_fffffffffffff9c0;
  hmm *in_stack_fffffffffffff9d8;
  string local_590 [32];
  string local_570 [7];
  undefined1 in_stack_fffffffffffffa97;
  int *in_stack_fffffffffffffa98;
  int in_stack_fffffffffffffaa4;
  string *in_stack_fffffffffffffaa8;
  string *in_stack_fffffffffffffab0;
  string local_530 [88];
  auto_ptr<hmm> local_4d8 [8];
  undefined1 local_491;
  undefined8 local_490;
  undefined8 local_488;
  undefined1 local_479;
  undefined8 local_478;
  undefined8 local_470;
  int local_468;
  undefined1 local_461;
  undefined8 local_460;
  undefined8 local_458;
  undefined1 local_449;
  undefined8 local_448;
  undefined8 local_440;
  int local_434;
  string local_430 [32];
  string local_410 [32];
  string local_3f0 [32];
  string local_3d0 [32];
  string local_3b0 [32];
  string local_390 [32];
  string local_370 [32];
  string local_350 [32];
  string local_330 [32];
  string local_310 [32];
  string local_2f0 [32];
  string local_2d0 [39];
  allocator local_2a9;
  string local_2a8 [39];
  undefined1 local_281 [33];
  int local_260;
  int local_25c;
  string local_258 [32];
  string local_238 [32];
  string local_218 [32];
  string local_1f8 [32];
  string local_1d8 [32];
  string local_1b8 [32];
  string local_198 [32];
  string local_178 [32];
  int local_158;
  allocator local_151;
  string local_150 [39];
  allocator local_129;
  string local_128 [36];
  int local_104;
  int local_100;
  undefined4 local_fc;
  int local_f8;
  allocator local_f1;
  string local_f0 [39];
  allocator local_c9;
  string local_c8 [39];
  allocator local_a1;
  string local_a0 [55];
  allocator local_69;
  string local_68 [44];
  int local_3c;
  byte local_36;
  byte local_35;
  int local_34;
  double local_8;
  
  local_35 = in_stack_00000020 & 1;
  local_36 = in_stack_00000028 & 1;
  local_34 = in_R9D;
  lVar2 = std::__cxx11::string::find((char *)in_RSI,0x3065e4);
  if ((lVar2 == -1) && (lVar2 = std::__cxx11::string::find((char *)in_RSI,0x3065e1), lVar2 == -1)) {
    return -1.0;
  }
  lVar2 = std::__cxx11::string::find((char *)in_RCX,0x3065e4);
  if ((lVar2 == -1) && (lVar2 = std::__cxx11::string::find((char *)in_RCX,0x3065e1), lVar2 == -1)) {
    return -1.0;
  }
  local_3c = 0;
  if (local_34 < in_stack_00000010) {
    local_68[0x24] = (string)0x0;
    local_68[0x25] = (string)0x0;
    local_68[0x26] = (string)0x0;
    local_68[0x27] = (string)0x0;
    local_68._40_4_ = in_stack_00000010 - local_34;
  }
  else {
    if (in_stack_00000010 < local_34) {
      local_68._36_4_ = local_34 - in_stack_00000010;
    }
    else {
      local_68[0x24] = (string)0x0;
      local_68[0x25] = (string)0x0;
      local_68[0x26] = (string)0x0;
      local_68[0x27] = (string)0x0;
    }
    local_68[0x28] = (string)0x0;
    local_68[0x29] = (string)0x0;
    local_68[0x2a] = (string)0x0;
    local_68[0x2b] = (string)0x0;
  }
  if (in_stack_00000008 < in_stack_00000018) {
    if (in_stack_00000010 < local_34) {
      local_3c = (in_stack_00000008 - local_34) + 1;
    }
    else if (local_34 < in_stack_00000010) {
      local_3c = (in_stack_00000008 - in_stack_00000010) + 1;
    }
    else if (local_34 == in_stack_00000010) {
      local_3c = (in_stack_00000008 - local_34) + 1;
    }
  }
  else if (in_stack_00000018 < in_stack_00000008) {
    if (in_stack_00000010 < local_34) {
      local_3c = (in_stack_00000018 - local_34) + 1;
    }
    else if (local_34 < in_stack_00000010) {
      local_3c = in_stack_00000018 - in_stack_00000010;
    }
    else if (local_34 == in_stack_00000010) {
      local_3c = (in_stack_00000018 - local_34) + 1;
    }
  }
  else if (in_stack_00000008 == in_stack_00000018) {
    if (local_34 < in_stack_00000010) {
      local_3c = (in_stack_00000008 - in_stack_00000010) + 1;
    }
    else if (in_stack_00000010 < local_34) {
      local_3c = (in_stack_00000008 - local_34) + 1;
    }
    else if (local_34 == in_stack_00000010) {
      local_3c = (in_stack_00000008 - local_34) + 1;
    }
  }
  if (local_3c < 0) {
    return -1.0;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"",&local_69);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"",&local_a1);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c8,"",&local_c9);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f0,"",&local_f1);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  minGCPositions = (int)in_stack_fffffffffffff9c0;
  __val = (int)((ulong)in_stack_fffffffffffff938 >> 0x20);
  local_f8 = -1;
  local_fc = 0;
  if (local_68._40_4_ == local_68._36_4_) {
    local_f8 = 0;
    std::__cxx11::string::operator=(local_68,in_RSI);
    std::__cxx11::string::operator=(local_a0,in_RDX);
    std::__cxx11::string::operator=(local_c8,in_RCX);
    std::__cxx11::string::operator=(local_f0,in_R8);
  }
  else {
    if (local_68._36_4_ == 0) {
      std::__cxx11::string::operator=(local_c8,in_RCX);
      std::__cxx11::string::operator=(local_f0,in_R8);
      local_100 = 0;
      local_104 = 0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_128,"0",&local_129);
      std::allocator<char>::~allocator((allocator<char> *)&local_129);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_150,"0",&local_151);
      std::allocator<char>::~allocator((allocator<char> *)&local_151);
      do {
        uVar5 = (ulong)local_104;
        uVar6 = std::__cxx11::string::size();
        bVar10 = false;
        if (uVar5 < uVar6) {
          uVar5 = (ulong)local_104;
          uVar6 = std::__cxx11::string::size();
          bVar10 = uVar5 < uVar6;
        }
        minGCPositions = (int)in_stack_fffffffffffff9c0;
        __val = (int)((ulong)in_stack_fffffffffffff938 >> 0x20);
        if (!bVar10) goto LAB_0026fff3;
        pcVar3 = (char *)std::__cxx11::string::at((ulong)in_RSI);
        if ((*pcVar3 == 'O') ||
           (in_stack_fffffffffffff9d8 = (hmm *)std::__cxx11::string::at((ulong)in_RSI),
           *(char *)&(in_stack_fffffffffffff9d8->switchRateMap)._M_h._M_buckets == 'C')) {
          local_f8 = local_f8 + 1;
          bVar10 = std::operator!=(in_stack_fffffffffffff8f0,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8))
          ;
          iVar1 = local_100;
          minGCPositions = (int)in_stack_fffffffffffff9c0;
          __val = (int)((ulong)in_stack_fffffffffffff938 >> 0x20);
          if (bVar10) {
            local_8 = -1.0;
            local_158 = 1;
            goto LAB_0026fffe;
          }
          local_100 = std::__cxx11::stoi(in_stack_fffffffffffff8f0,
                                         (size_t *)
                                         CONCAT44(in_stack_fffffffffffff8ec,
                                                  in_stack_fffffffffffff8e8),0);
          minGCPositions = (int)in_stack_fffffffffffff9c0;
          __val = (int)((ulong)in_stack_fffffffffffff938 >> 0x20);
          local_100 = iVar1 + local_100;
          if (local_100 == local_68._40_4_) {
            std::__cxx11::string::substr((ulong)local_178,(ulong)in_RSI);
            std::__cxx11::string::operator+=(local_68,local_178);
            std::__cxx11::string::~string(local_178);
            std::__cxx11::string::substr((ulong)local_198,(ulong)in_RDX);
            std::__cxx11::string::operator+=(local_a0,local_198);
            std::__cxx11::string::~string(local_198);
            goto LAB_0026fff3;
          }
          if ((int)local_68._40_4_ < local_100) goto code_r0x0026fd03;
          local_100 = local_100 + 2;
          std::__cxx11::string::operator=(local_128,"0");
          std::__cxx11::string::operator=(local_150,"0");
        }
        else {
          std::__cxx11::string::at((ulong)in_RSI);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff908._M_current,
                         (char)((ulong)in_stack_fffffffffffff900 >> 0x38));
          std::__cxx11::string::operator=(local_128,local_238);
          std::__cxx11::string::~string(local_238);
          in_stack_fffffffffffff9c0 = std::__cxx11::string::at((ulong)in_RSI);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff908._M_current,
                         (char)((ulong)in_stack_fffffffffffff900 >> 0x38));
          std::__cxx11::string::operator=(local_150,local_258);
          std::__cxx11::string::~string(local_258);
        }
        local_104 = local_104 + 1;
      } while( true );
    }
    if (local_68._40_4_ == 0) {
      std::__cxx11::string::operator=(local_68,in_RSI);
      std::__cxx11::string::operator=(local_a0,in_RDX);
      local_25c = 0;
      local_260 = 0;
      in_stack_fffffffffffff9b0 = (hmm *)local_281;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_281 + 1),"0",(allocator *)in_stack_fffffffffffff9b0);
      std::allocator<char>::~allocator((allocator<char> *)local_281);
      in_stack_fffffffffffff9a8 = &local_2a9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2a8,"0",in_stack_fffffffffffff9a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
      do {
        in_stack_fffffffffffff998 = (string *)(long)local_260;
        psVar4 = (string *)std::__cxx11::string::size();
        in_stack_fffffffffffff9a7 = false;
        if (in_stack_fffffffffffff998 < psVar4) {
          in_stack_fffffffffffff990 = (string *)(long)local_260;
          psVar4 = (string *)std::__cxx11::string::size();
          in_stack_fffffffffffff9a7 = in_stack_fffffffffffff990 < psVar4;
        }
        minGCPositions = (int)in_stack_fffffffffffff9c0;
        __val = (int)((ulong)in_stack_fffffffffffff938 >> 0x20);
        if ((bool)in_stack_fffffffffffff9a7 == false) goto LAB_002706ec;
        in_stack_fffffffffffff988 = (string *)std::__cxx11::string::at((ulong)in_RCX);
        if ((in_stack_fffffffffffff988->_M_dataplus == (_Alloc_hider)0x4f) ||
           (pcVar3 = (char *)std::__cxx11::string::at((ulong)in_RCX), *pcVar3 == 'C')) {
          local_f8 = local_f8 + 1;
          bVar10 = std::operator!=(in_stack_fffffffffffff8f0,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8))
          ;
          iVar1 = local_25c;
          minGCPositions = (int)in_stack_fffffffffffff9c0;
          __val = (int)((ulong)in_stack_fffffffffffff938 >> 0x20);
          if (bVar10) {
            local_8 = -1.0;
            local_158 = 1;
            goto LAB_002706f7;
          }
          local_25c = std::__cxx11::stoi(in_stack_fffffffffffff8f0,
                                         (size_t *)
                                         CONCAT44(in_stack_fffffffffffff8ec,
                                                  in_stack_fffffffffffff8e8),0);
          minGCPositions = (int)in_stack_fffffffffffff9c0;
          __val = (int)((ulong)in_stack_fffffffffffff938 >> 0x20);
          local_25c = iVar1 + local_25c;
          if (local_25c == local_68._36_4_) {
            std::__cxx11::string::substr((ulong)local_2d0,(ulong)in_RCX);
            std::__cxx11::string::operator+=(local_c8,local_2d0);
            std::__cxx11::string::~string(local_2d0);
            std::__cxx11::string::substr((ulong)local_2f0,(ulong)in_R8);
            std::__cxx11::string::operator+=(local_f0,local_2f0);
            std::__cxx11::string::~string(local_2f0);
            goto LAB_002706ec;
          }
          if ((int)local_68._36_4_ < local_25c) goto code_r0x00270402;
          local_25c = local_25c + 2;
          std::__cxx11::string::operator=((string *)(local_281 + 1),"0");
          std::__cxx11::string::operator=(local_2a8,"0");
        }
        else {
          std::__cxx11::string::at((ulong)in_RCX);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff908._M_current,
                         (char)((ulong)in_stack_fffffffffffff900 >> 0x38));
          std::__cxx11::string::operator=((string *)(local_281 + 1),local_390);
          std::__cxx11::string::~string(local_390);
          std::__cxx11::string::at((ulong)in_RCX);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff908._M_current,
                         (char)((ulong)in_stack_fffffffffffff900 >> 0x38));
          std::__cxx11::string::operator=(local_2a8,local_3b0);
          std::__cxx11::string::~string(local_3b0);
        }
        local_260 = local_260 + 1;
      } while( true );
    }
  }
  goto LAB_00270747;
code_r0x0026fd03:
  std::__cxx11::to_string(__val);
  std::__cxx11::string::operator+=(local_68,local_1b8);
  std::__cxx11::string::~string(local_1b8);
  std::__cxx11::to_string(__val);
  std::__cxx11::string::operator+=(local_a0,local_1d8);
  std::__cxx11::string::~string(local_1d8);
  std::__cxx11::string::substr((ulong)local_1f8,(ulong)in_RSI);
  std::__cxx11::string::operator+=(local_68,local_1f8);
  std::__cxx11::string::~string(local_1f8);
  std::__cxx11::string::substr((ulong)local_218,(ulong)in_RDX);
  std::__cxx11::string::operator+=(local_a0,local_218);
  std::__cxx11::string::~string(local_218);
LAB_0026fff3:
  local_158 = 0;
LAB_0026fffe:
  std::__cxx11::string::~string(local_150);
  std::__cxx11::string::~string(local_128);
  goto joined_r0x00270021;
code_r0x00270402:
  std::__cxx11::to_string(__val);
  std::__cxx11::string::operator+=(local_c8,local_310);
  std::__cxx11::string::~string(local_310);
  std::__cxx11::to_string(__val);
  std::__cxx11::string::operator+=(local_f0,local_330);
  std::__cxx11::string::~string(local_330);
  std::__cxx11::string::substr((ulong)local_350,(ulong)in_RCX);
  std::__cxx11::string::operator+=(local_c8,local_350);
  std::__cxx11::string::~string(local_350);
  std::__cxx11::string::substr((ulong)local_370,(ulong)in_R8);
  std::__cxx11::string::operator+=(local_f0,local_370);
  std::__cxx11::string::~string(local_370);
LAB_002706ec:
  local_158 = 0;
LAB_002706f7:
  std::__cxx11::string::~string(local_2a8);
  std::__cxx11::string::~string((string *)(local_281 + 1));
joined_r0x00270021:
  if (local_158 == 0) {
LAB_00270747:
    lVar2 = std::__cxx11::string::size();
    if (lVar2 == 0) {
      std::__cxx11::to_string(__val);
      std::__cxx11::string::operator+=(local_68,local_3d0);
      std::__cxx11::string::~string(local_3d0);
      std::__cxx11::to_string(__val);
      std::__cxx11::string::operator+=(local_a0,local_3f0);
      std::__cxx11::string::~string(local_3f0);
    }
    else {
      lVar2 = std::__cxx11::string::size();
      if (lVar2 == 0) {
        std::__cxx11::to_string(__val);
        std::__cxx11::string::operator+=(local_c8,local_410);
        std::__cxx11::string::~string(local_410);
        std::__cxx11::to_string(__val);
        std::__cxx11::string::operator+=(local_f0,local_430);
        std::__cxx11::string::~string(local_430);
      }
    }
    uVar5 = std::__cxx11::string::size();
    uVar6 = std::__cxx11::string::size();
    if (uVar6 < uVar5) {
      trimCodes(in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa4,
                in_stack_fffffffffffffa98,(bool)in_stack_fffffffffffffa97);
      trimCodes(in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa4,
                in_stack_fffffffffffffa98,(bool)in_stack_fffffffffffffa97);
    }
    else {
      uVar5 = std::__cxx11::string::size();
      uVar6 = std::__cxx11::string::size();
      if (uVar5 < uVar6) {
        trimCodes(in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa4,
                  in_stack_fffffffffffffa98,(bool)in_stack_fffffffffffffa97);
        trimCodes(in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa4,
                  in_stack_fffffffffffffa98,(bool)in_stack_fffffffffffffa97);
      }
      else {
        trimCodes(in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa4,
                  in_stack_fffffffffffffa98,(bool)in_stack_fffffffffffffa97);
        trimCodes(in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa4,
                  in_stack_fffffffffffffa98,(bool)in_stack_fffffffffffffa97);
      }
    }
    local_440 = std::__cxx11::string::begin();
    local_448 = std::__cxx11::string::end();
    local_449 = 0x4f;
    dVar7 = std::count<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                      (in_stack_fffffffffffff910,in_stack_fffffffffffff908,in_stack_fffffffffffff900
                      );
    local_458 = std::__cxx11::string::begin();
    local_460 = std::__cxx11::string::end();
    local_461 = 0x43;
    dVar8 = std::count<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                      (in_stack_fffffffffffff910,in_stack_fffffffffffff908,in_stack_fffffffffffff900
                      );
    local_434 = (int)dVar7 + (int)dVar8;
    local_470 = std::__cxx11::string::begin();
    local_478 = std::__cxx11::string::end();
    local_479 = 0x4f;
    dVar7 = std::count<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                      (in_stack_fffffffffffff910,in_stack_fffffffffffff908,in_stack_fffffffffffff900
                      );
    __first._M_current = (char *)local_c8;
    local_488 = std::__cxx11::string::begin();
    local_490 = std::__cxx11::string::end();
    local_491 = 0x43;
    dVar8 = std::count<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                      (__first,in_stack_fffffffffffff908,in_stack_fffffffffffff900);
    local_468 = (int)dVar7 + (int)dVar8;
    if (local_434 == local_468) {
      if (local_434 < in_stack_00000030) {
        local_8 = -1.0;
        local_158 = 1;
      }
      else {
        lVar2 = std::__cxx11::string::size();
        lVar9 = std::__cxx11::string::size();
        if (lVar2 == lVar9) {
          std::
          unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
          ::unordered_map((unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                           *)0x270ca0);
          if ((local_35 & 1) == 0) {
            std::
            unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
            ::operator=((unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                         *)in_stack_fffffffffffff8f0,
                        (unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                         *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8));
          }
          else {
            std::
            unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
            ::operator=((unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                         *)in_stack_fffffffffffff8f0,
                        (unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                         *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8));
          }
          __p = (element_type *)operator_new(0x250);
          std::
          unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
          ::unordered_map((unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                           *)in_stack_fffffffffffff8f0,
                          (unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                           *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8));
          std::__cxx11::string::string(local_530,local_68);
          std::__cxx11::string::string((string *)&stack0xfffffffffffffab0,local_a0);
          std::__cxx11::string::string(local_570,local_c8);
          std::__cxx11::string::string(local_590,local_f0);
          hmm::hmm(in_stack_fffffffffffff9b0,
                   (unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                    *)in_stack_fffffffffffff9a8,
                   (string *)CONCAT17(in_stack_fffffffffffff9a7,in_stack_fffffffffffff9a0),
                   in_stack_fffffffffffff998,in_stack_fffffffffffff990,in_stack_fffffffffffff988,
                   minGCPositions);
          this_00 = local_4d8;
          std::auto_ptr<hmm>::auto_ptr(this_00,__p);
          std::__cxx11::string::~string(local_590);
          std::__cxx11::string::~string(local_570);
          std::__cxx11::string::~string((string *)&stack0xfffffffffffffab0);
          std::__cxx11::string::~string(local_530);
          std::
          unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
          ::~unordered_map((unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                            *)0x270e29);
          std::auto_ptr<hmm>::operator->(this_00);
          dVar11 = hmm::calculateProbability(in_stack_fffffffffffff9d8);
          if ((dVar11 != -1000.0) || (NAN(dVar11))) {
            if (dVar11 <= *(double *)(in_RDI + 8)) {
              local_8 = -1.0;
            }
            else {
              local_8 = 1.0;
            }
          }
          else {
            local_8 = -1.0;
          }
          local_158 = 1;
          std::auto_ptr<hmm>::~auto_ptr(this_00);
          std::
          unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
          ::~unordered_map((unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                            *)0x271019);
        }
        else {
          local_8 = -1.0;
          local_158 = 1;
        }
      }
    }
    else {
      local_8 = -1.0;
      local_158 = 1;
    }
  }
  std::__cxx11::string::~string(local_f0);
  std::__cxx11::string::~string(local_c8);
  std::__cxx11::string::~string(local_a0);
  std::__cxx11::string::~string(local_68);
  return local_8;
}

Assistant:

double NoMeEdgeCalculator::scoreSequences(std::string code1,std::string qual1, std::string code2,std::string qual2 , int start1, int end1, int start2, int end2 , bool isStrand1,bool isClique,int numGCAllowedPos, int ct) const{

    if((code1.find("C") != std::string::npos) || (code1.find("O") != std::string::npos)){
        if((code2.find("C") != std::string::npos) || (code2.find("O") != std::string::npos)){

        }else{
            return -1;
        }
    }else{
        return -1;
    }

    int overlap= 0;
    int s1=0;
    int s2=0;
    if(start1<start2){
        s2 = 0;
        s1 = start2-start1;
    }else if (start1>start2) {
        s1=0;
        s2=start1-start2;
    }else if (start1==start2) {
        s1=0;
        s2=0;
    }

    if(end1<end2){
        if(start1>start2){
            //          ----------------
           //     -------------------------------
            overlap=end1-start1+1;
        }else if (start1<start2) {
            //     --------------
            //        -----------------
            overlap=end1-start2+1;
        }else if (start1==start2) {
            //     -------------
            //     -----------------------
            overlap=end1-start1+1;
        }

    }else if (end1>end2) {
        if(start1>start2){
            //               ------------------
            //        -----------------
            overlap=end2-start1+1;
        }else if (start1<start2) {
            //     --------------------
            //        -----------
            overlap=end2-start2;
        }else if (start1==start2) {
            //        ------------------
            //        -----------
            overlap=end2-start1+1;
        }
    }else if (end1==end2) {
        if(start1<start2){
            //        ------------------
            //             -------------
            overlap=end1-start2+1;
        }else if (start1>start2) {
            //               -----------
            //        ------------------
            overlap=end1-start1+1;
        }else if (start1 == start2) {
            //        ------------------
            //        ------------------
            overlap=end1-start1+1 ;
        }
    }

    if(overlap<0){
        return -1;
    }


    string compareString1="";
    string compareQual1="";
    string compareString2="";
    string compareQual2="";
    int leftNonOverlapGCCount = -1;
    int rightNonOverlapGCCount = 0;

    if(s1==s2){
        leftNonOverlapGCCount = 0;
        compareString1 = code1;
        compareQual1 = qual1;
        compareString2 = code2;
        compareQual2 = qual2;
    }else if(s2==0){
        compareString2 = code2;
        compareQual2 = qual2;
        int distance = 0;
        int i = 0;
        string prevCountCode = "0";
        string prevCountQual = "0";
        while(i<code1.size() && i<qual1.size()){
            if(code1.at(i)=='O'||code1.at(i)=='C'){
                leftNonOverlapGCCount++;
                if(prevCountCode!=prevCountQual){
                    return -1;
                }
                distance = distance + std::stoi(prevCountCode);
                if(distance==s1){
                    compareString1 += code1.substr(i);
                    compareQual1 += qual1.substr(i);
                    break;
                }else if(distance>s1){
                   compareString1 += std::to_string(distance - s1);
                   compareQual1 += std::to_string(distance - s1);
                   compareString1 += code1.substr(i);
                   compareQual1 += qual1.substr(i);
                   break;
                }

                distance = distance + 2;
                prevCountCode = "0";
                prevCountQual = "0";
                i++;
            }else{
                prevCountCode = prevCountCode + code1.at(i);
                prevCountQual = prevCountQual + code1.at(i);
                i++;
            }
        }
    }else if(s1==0){
        compareString1 = code1;
        compareQual1 = qual1;
        int distance = 0;
        int i = 0;
        string prevCountCode = "0";
        string prevCountQual = "0";
        while(i<code2.size() && i<qual2.size()){
            if(code2.at(i)=='O'||code2.at(i)=='C'){
                leftNonOverlapGCCount++;
                if(prevCountCode!=prevCountQual){
                    return -1;
                }
                distance = distance + std::stoi(prevCountCode);
                if(distance==s2){
                    compareString2 += code2.substr(i);
                    compareQual2 += qual2.substr(i);
                    break;
                }else if(distance>s2){
                   compareString2 += std::to_string(distance - s2);
                   compareQual2 += std::to_string(distance - s2);
                   compareString2 += code2.substr(i);
                   compareQual2 += qual2.substr(i);
                   break;
                }

                distance = distance + 2;
                prevCountCode = "0";
                prevCountQual = "0";
                i++;
            }else{
                prevCountCode = prevCountCode + code2.at(i);
                prevCountQual = prevCountQual + code2.at(i);
                i++;
            }
        }
    }

    if(compareString1.size()==0){
        compareString1 += std::to_string(overlap);
        compareQual1 += std::to_string(overlap);
    }else if(compareString2.size()==0){
        compareString2 += std::to_string(overlap);
        compareQual2 += std::to_string(overlap);
    }
      if(compareString1.size()>compareString2.size()){
        trimCodes(compareString1,compareQual1,overlap,rightNonOverlapGCCount,true);
        trimCodes(compareString2,compareQual2,overlap,rightNonOverlapGCCount,false);
    }else if(compareString1.size()<compareString2.size()){
        trimCodes(compareString1,compareQual1,overlap,rightNonOverlapGCCount,false);
        trimCodes(compareString2,compareQual2,overlap,rightNonOverlapGCCount,true);
    }else{
        trimCodes(compareString1,compareQual1,overlap,rightNonOverlapGCCount,false);
        trimCodes(compareString2,compareQual2,overlap,rightNonOverlapGCCount,false);
    }

    int numberOfPositions1= std::count(compareString1.begin(), compareString1.end(), 'O') + std::count(compareString1.begin(), compareString1.end(), 'C');
    int numberOfPositions2= std::count(compareString2.begin(), compareString2.end(), 'O') + std::count(compareString2.begin(), compareString2.end(), 'C');
    if(numberOfPositions1!=numberOfPositions2) return -1;

    if(numberOfPositions1<numGCAllowedPos){
        return -1;
    }


    if(compareString1.size()!=compareString2.size()){
        return -1;
    }


    //Needed for checking the non overlapping sections
//    if(nonOverlap>0){
//        if(leftNonOverlapGCCount>nonOverlap || rightNonOverlapGCCount>nonOverlap){
//            return -1;
//        }
//    }

    std::unordered_map<int, double> switchRateMap;
    if(isStrand1){
        switchRateMap = this->switchRateFS;
    }else{
        switchRateMap = this->switchRateRS;
    }
    std::auto_ptr<hmm> hmmProbability(new hmm(switchRateMap,compareString1,compareQual1,compareString2,compareQual2,numGCAllowedPos));

   double score = hmmProbability->calculateProbability();
   double prob = nomeParam;

   if(score == -1000){//meaning that there is something wrong with the codes
       return -1;
   }else{
//       //For ideal Graph
//       //specificPositionErrorMap[numberOfPositions1] = std::make_pair((specificPositionErrorMap[numberOfPositions1].first+1),(specificPositionErrorMap[numberOfPositions1].second));
//       return 1;
       //For normal edge Criterion
       if(score > prob){
           return 1;
       }else{
           return -1;
       }
   }
}